

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O2

void history_find_artifact(player *p,artifact *artifact)

{
  byte bVar1;
  size_t sVar2;
  history_info *phVar3;
  long lVar4;
  long lVar5;
  artifact *in_RDX;
  long lVar6;
  bitflag flags [2];
  char text [80];
  char o_name [80];
  
  if (artifact == (artifact *)0x0) {
    __assert_fail("artifact != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-history.c"
                  ,0xe1,"void history_find_artifact(struct player *, const struct artifact *)");
  }
  sVar2 = (p->hist).next;
  lVar6 = sVar2 * -0x5c;
  lVar5 = sVar2 * 0x5c + -0x56;
  lVar4 = sVar2 + 1;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      get_artifact_name(o_name,(size_t)artifact,in_RDX);
      strnfmt(text,0x50,"Found %s",o_name);
      flag_wipe(flags,2);
      flag_on_dbg(flags,2,3,"flags","HIST_ARTIFACT_KNOWN");
      history_add_with_flags(p,text,flags,artifact);
      return;
    }
    lVar6 = lVar6 + 0x5c;
    phVar3 = (p->hist).entries;
    bVar1 = phVar3->type[lVar5];
    in_RDX = (artifact *)(ulong)bVar1;
    lVar5 = lVar5 + -0x5c;
  } while (artifact->aidx != (uint)bVar1);
  flag_off((bitflag *)((long)phVar3 - lVar6),2,2);
  flag_on_dbg((bitflag *)((long)(p->hist).entries - lVar6),2,3,"h->entries[i].type",
              "HIST_ARTIFACT_KNOWN");
  return;
}

Assistant:

void history_find_artifact(struct player *p, const struct artifact *artifact)
{
	assert(artifact != NULL);

	/* Try revealing any existing artifact, otherwise log it */
	if (!history_mark_artifact_known(&p->hist, artifact)) {
		char o_name[80];
		char text[80];

		get_artifact_name(o_name, sizeof(o_name), artifact);
		strnfmt(text, sizeof(text), "Found %s", o_name);

		bitflag flags[HIST_SIZE];
		hist_wipe(flags);
		hist_on(flags, HIST_ARTIFACT_KNOWN);

		history_add_with_flags(p, text, flags, artifact);
	}
}